

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloter_interface.h
# Opt level: O0

void __thiscall
cppnet::AlloterWrap::PoolDelete<cppnet::BufferBlock>(AlloterWrap *this,BufferBlock **c)

{
  element_type *peVar1;
  BufferBlock *local_28;
  void *data;
  BufferBlock **ppBStack_18;
  uint32_t len;
  BufferBlock **c_local;
  AlloterWrap *this_local;
  
  if (*c != (BufferBlock *)0x0) {
    ppBStack_18 = c;
    c_local = (BufferBlock **)this;
    (**((*c)->super_InnerBuffer).super_Buffer._vptr_Buffer)();
    data._4_4_ = 0x70;
    local_28 = *ppBStack_18;
    peVar1 = std::__shared_ptr_access<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    (*peVar1->_vptr_Alloter[5])(peVar1,&local_28,(ulong)data._4_4_);
    *ppBStack_18 = (BufferBlock *)0x0;
  }
  return;
}

Assistant:

void AlloterWrap::PoolDelete(T* &c) {
    if (!c) {
        return;
    }

    c->~T();

    uint32_t len = sizeof(T);
    void* data = (void*)c;
    _alloter->Free(data, len);
    c = nullptr;
}